

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

value_type * __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
CreateValueTypeInternal
          (Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this,MapKey *key)

{
  unsigned_long uVar1;
  ArenaImpl *pAVar2;
  size_t *in_RDI;
  value_type *value;
  size_t n;
  undefined4 in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  LogMessage *in_stack_fffffffffffffea0;
  MapKey *in_stack_fffffffffffffea8;
  Arena *in_stack_fffffffffffffeb0;
  size_t n_00;
  value_type *local_d8;
  ArenaImpl *local_80;
  value_type *local_70;
  MapKey local_48 [3];
  size_t local_10;
  size_t local_8;
  
  if (*in_RDI == 0) {
    local_d8 = (value_type *)operator_new(0x20);
    MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapPair
              ((MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef> *)
               in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  }
  else {
    n_00 = *in_RDI;
    local_80 = (ArenaImpl *)0x20;
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 < 0x20) {
      internal::LogMessage::LogMessage
                ((LogMessage *)in_stack_fffffffffffffeb0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                 (char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffea0,
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      internal::LogMessage::operator<<
                (in_stack_fffffffffffffea0,
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffea0,
                 (LogMessage *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      internal::LogMessage::~LogMessage((LogMessage *)0x42166c);
    }
    if (n_00 == 0) {
      local_70 = (value_type *)operator_new__(0x20);
    }
    else {
      local_10 = 0x20;
      local_8 = n_00;
      pAVar2 = (ArenaImpl *)std::numeric_limits<unsigned_long>::max();
      if (pAVar2 < local_80) {
        in_stack_fffffffffffffea8 = local_48;
        internal::LogMessage::LogMessage
                  ((LogMessage *)in_stack_fffffffffffffeb0,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                   (char *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c);
        in_stack_fffffffffffffeb0 =
             (Arena *)internal::LogMessage::operator<<
                                (in_stack_fffffffffffffea0,
                                 (char *)CONCAT44(in_stack_fffffffffffffe9c,
                                                  in_stack_fffffffffffffe98));
        in_stack_fffffffffffffea0 =
             internal::LogMessage::operator<<
                       (in_stack_fffffffffffffea0,
                        (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffea0,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
        internal::LogMessage::~LogMessage((LogMessage *)0x4217b0);
      }
      internal::AlignUpTo8(local_10);
      Arena::AllocHook(in_stack_fffffffffffffeb0,(type_info *)in_stack_fffffffffffffea8,
                       (size_t)in_stack_fffffffffffffea0);
      local_70 = (value_type *)internal::ArenaImpl::AllocateAligned(local_80,n_00);
    }
    Arena::CreateInArenaStorage<google::protobuf::MapKey>
              ((MapKey *)in_stack_fffffffffffffea0,
               (Arena *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    Arena::CreateInArenaStorage<google::protobuf::MapValueRef>
              ((MapValueRef *)in_stack_fffffffffffffea0,
               (Arena *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    MapKey::operator=((MapKey *)in_stack_fffffffffffffea0,
                      (MapKey *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    local_d8 = local_70;
  }
  return local_d8;
}

Assistant:

value_type* CreateValueTypeInternal(const Key& key) {
    if (arena_ == NULL) {
      return new value_type(key);
    } else {
      value_type* value = reinterpret_cast<value_type*>(
          Arena::CreateArray<uint8>(arena_, sizeof(value_type)));
      Arena::CreateInArenaStorage(const_cast<Key*>(&value->first), arena_);
      Arena::CreateInArenaStorage(&value->second, arena_);
      const_cast<Key&>(value->first) = key;
      return value;
    }
  }